

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

void __thiscall tcu::anon_unknown_4::Test::testULP(Test *this,double arg,double ref)

{
  ostream *poVar1;
  string *expr;
  double result;
  ostringstream oss;
  Test local_1a8;
  undefined1 local_198 [24];
  string local_180 [3];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_198 + 0x10),"ulp(",4);
  poVar1 = std::ostream::_M_insert<double>(arg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  expr = local_180;
  std::__cxx11::stringbuf::str();
  result = FloatFormat::ulp((this->m_fmt).
                            super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                            .m_data.ptr,arg,1.0);
  check(&local_1a8,expr,result,ref);
  if (local_1a8.m_fmt.super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.
      m_data.ptr != (FloatFormat *)local_198) {
    operator_delete(local_1a8.m_fmt.
                    super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data
                    .ptr,local_198._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 0x10));
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void Test::testULP (double arg, double ref) const
{
	ostringstream	oss;

	oss << "ulp(" << arg << ")";
	check(oss.str(), m_fmt->ulp(arg), ref);
}